

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O0

uint32_t crc32_bitwise(void *data,size_t length,uint32_t previousCrc32)

{
  size_t sVar1;
  byte *pbVar2;
  int local_2c;
  byte *pbStack_28;
  int j;
  uint8_t *current;
  uint32_t crc;
  uint32_t previousCrc32_local;
  size_t length_local;
  void *data_local;
  
  current._0_4_ = previousCrc32 ^ 0xffffffff;
  pbStack_28 = (byte *)data;
  _crc = length;
  while (sVar1 = _crc - 1, _crc != 0) {
    pbVar2 = pbStack_28 + 1;
    current._0_4_ = *pbStack_28 ^ (uint)current;
    for (local_2c = 0; pbStack_28 = pbVar2, _crc = sVar1, local_2c < 8; local_2c = local_2c + 1) {
      current._0_4_ = (uint)current >> 1 ^ -((uint)current & 1) & 0xedb88320;
    }
  }
  return (uint)current ^ 0xffffffff;
}

Assistant:

uint32_t crc32_bitwise(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint8_t* current = (const uint8_t*) data;

  while (length-- != 0)
  {
    crc ^= *current++;

    for (int j = 0; j < 8; j++)
    {
      // branch-free
      crc = (crc >> 1) ^ (-int32_t(crc & 1) & Polynomial);

      // branching, much slower:
      //if (crc & 1)
      //  crc = (crc >> 1) ^ Polynomial;
      //else
      //  crc =  crc >> 1;
    }
  }

  return ~crc; // same as crc ^ 0xFFFFFFFF
}